

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink)

{
  EchoProgress *this_00;
  cmGeneratorTarget *target;
  cmLocalUnixMakefileGenerator3 *lg;
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  cmOutputConverter *this_01;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  string_view local_1c0;
  string local_1b0;
  cmAlphaNum local_190;
  cmAlphaNum local_160;
  undefined1 local_130 [8];
  string buildEcho;
  EchoProgress progress;
  undefined1 local_b0 [8];
  string targetOutput;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  string *objExt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string local_38;
  undefined1 local_12;
  byte local_11;
  bool requiresDeviceLinking;
  cmMakefileExecutableTargetGenerator *pcStack_10;
  bool relink_local;
  cmMakefileExecutableTargetGenerator *this_local;
  
  target = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  lg = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  local_11 = relink;
  pcStack_10 = this;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_38,&this->super_cmMakefileTargetGenerator);
  bVar2 = requireDeviceLinking(target,(cmLocalGenerator *)lg,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar2) {
    local_12 = bVar2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&objExt);
    pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"CMAKE_CUDA_OUTPUT_EXTENSION",
               (allocator<char> *)(targetOutput.field_2._M_local_buf + 0xf));
    psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)(targetOutput.field_2._M_local_buf + 0xf));
    local_68 = psVar3;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&progress.Arg.field_2 + 8),
                   &((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                    GeneratorTarget)->ObjectDirectory,"cmake_device_link");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&progress.Arg.field_2 + 8),local_68);
    std::__cxx11::string::~string((string *)(progress.Arg.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)&this->DeviceLinkObject,(string *)local_b0);
    (this->super_cmMakefileTargetGenerator).NumberOfProgressActions =
         (this->super_cmMakefileTargetGenerator).NumberOfProgressActions + 1;
    if (((this->super_cmMakefileTargetGenerator).NoRuleMessages & 1U) == 0) {
      this_00 = (EchoProgress *)((long)&buildEcho.field_2 + 8);
      cmLocalUnixMakefileGenerator3::EchoProgress::EchoProgress(this_00);
      cmMakefileTargetGenerator::MakeEchoProgress(&this->super_cmMakefileTargetGenerator,this_00);
      cmAlphaNum::cmAlphaNum(&local_160,"Linking CUDA device code ");
      this_01 = &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                 super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
      cmOutputConverter::MaybeRelativeToCurBinDir(&local_1e0,this_01,&this->DeviceLinkObject);
      local_1c0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1e0);
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_1b0,this_01,local_1c0,SHELL);
      cmAlphaNum::cmAlphaNum(&local_190,&local_1b0);
      cmStrCat<>((string *)local_130,&local_160,&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1e0);
      cmLocalUnixMakefileGenerator3::AppendEcho
                ((this->super_cmMakefileTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&objExt,(string *)local_130,EchoLink,
                 (EchoProgress *)((long)&buildEcho.field_2 + 8));
      std::__cxx11::string::~string((string *)local_130);
      cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress
                ((EchoProgress *)((long)&buildEcho.field_2 + 8));
    }
    pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,"CMAKE_CUDA_COMPILER_ID",&local_201);
    psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_200);
    bVar2 = std::operator==(psVar3,"Clang");
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    if (bVar2) {
      cmMakefileTargetGenerator::WriteDeviceLinkRule
                (&this->super_cmMakefileTargetGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&objExt,(string *)local_b0);
    }
    else {
      (*(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
        _vptr_cmCommonTargetGenerator[8])(this,(ulong)(local_11 & 1),&objExt,local_b0);
    }
    cmMakefileTargetGenerator::WriteTargetDriverRule
              (&this->super_cmMakefileTargetGenerator,(string *)local_b0,(bool)(local_11 & 1));
    std::__cxx11::string::~string((string *)local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&objExt);
  }
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule(
  bool relink)
{
#ifndef CMAKE_BOOTSTRAP
  const bool requiresDeviceLinking = requireDeviceLinking(
    *this->GeneratorTarget, *this->LocalGenerator, this->GetConfigName());
  if (!requiresDeviceLinking) {
    return;
  }

  std::vector<std::string> commands;

  // Get the name of the device object to generate.
  std::string const& objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");
  std::string const targetOutput =
    this->GeneratorTarget->ObjectDirectory + "cmake_device_link" + objExt;
  this->DeviceLinkObject = targetOutput;

  this->NumberOfProgressActions++;
  if (!this->NoRuleMessages) {
    cmLocalUnixMakefileGenerator3::EchoProgress progress;
    this->MakeEchoProgress(progress);
    // Add the link message.
    std::string buildEcho = cmStrCat(
      "Linking CUDA device code ",
      this->LocalGenerator->ConvertToOutputFormat(
        this->LocalGenerator->MaybeRelativeToCurBinDir(this->DeviceLinkObject),
        cmOutputConverter::SHELL));
    this->LocalGenerator->AppendEcho(
      commands, buildEcho, cmLocalUnixMakefileGenerator3::EchoLink, &progress);
  }

  if (this->Makefile->GetSafeDefinition("CMAKE_CUDA_COMPILER_ID") == "Clang") {
    this->WriteDeviceLinkRule(commands, targetOutput);
  } else {
    this->WriteNvidiaDeviceExecutableRule(relink, commands, targetOutput);
  }

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(targetOutput, relink);
#else
  static_cast<void>(relink);
#endif
}